

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O3

bool __thiscall ADSBBase::ProcessFetchedData(ADSBBase *this)

{
  long *plVar1;
  int iVar2;
  JSON_Object *pJVar3;
  JSON_Array *array;
  size_t sVar4;
  char *__s;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  FDKeyType _eType;
  ulong index;
  bool bVar6;
  bool bVar7;
  double dVar8;
  string hexKey;
  FDKeyTy fdKey;
  string acFilter;
  positionTy viewPos;
  long *local_150;
  char *local_148;
  long local_140 [2];
  JSON_Value *local_130;
  long *local_128;
  size_t local_120;
  long local_118 [2];
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_d8;
  double local_b8;
  JSON_Array *local_b0;
  string local_a8;
  double local_88;
  undefined1 local_78 [72];
  
  if (((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse | 2U) == 0x193) {
    if ((int)dataRefs.iLogLevel < 4) {
      sVar4 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
      if (sVar4 == 0) {
        pcVar5 = "";
      }
      else {
        FetchMsg_abi_cxx11_((string *)local_78,
                            (ADSBBase *)
                            (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
        pcVar5 = (char *)local_78._0_8_;
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x3a,"ProcessFetchedData",logERR,"ADS-B Exchange: API Key test FAILED: %s",pcVar5);
      in_RDX = extraout_RDX;
      if ((sVar4 != 0) && ((undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        in_RDX = extraout_RDX_00;
      }
    }
    sVar4 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
    if (sVar4 == 0) {
      pcVar5 = "";
    }
    else {
      FetchMsg_abi_cxx11_((string *)local_108,
                          (ADSBBase *)
                          (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
      pcVar5 = (char *)local_108._0_8_;
    }
    CreateMsgWindow(12.0,logERR,"ADS-B Exchange: API Key test FAILED: %s",pcVar5);
    if ((sVar4 != 0) && ((undefined1 *)local_108._0_8_ != local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
              (this,0,1);
    return false;
  }
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
LAB_00147442:
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  local_130 = json_parse_string((char *)0x146e86);
  if (local_130 == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x48,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    goto LAB_00147442;
  }
  pJVar3 = json_object(local_130);
  if (pJVar3 == (JSON_Object *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x4c,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  else {
    iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[0x16])(this,pJVar3);
    if ((char)iVar2 != '\0') {
      DataRefs::GetViewPos();
      dVar8 = jog_n_nan(pJVar3,"now");
      if (NAN(dVar8)) {
        dVar8 = json_object_dotget_number(pJVar3,"ctime");
      }
      local_88 = (double)(~-(ulong)(70000000000.0 < dVar8) & (ulong)dVar8 |
                         (ulong)(dVar8 / 1000.0) & -(ulong)(70000000000.0 < dVar8));
      if (1546344000.0 < local_88) {
        DataRefs::ChTsOffsetAdd(&dataRefs,local_88);
      }
      local_b8 = (double)dataRefs.fdBufPeriod;
      DataRefs::GetDebugAcFilter_abi_cxx11_(&local_a8,&dataRefs);
      array = json_object_get_array(pJVar3,"ac");
      if ((array == (JSON_Array *)0x0) &&
         (array = json_object_get_array(pJVar3,"aircraft"), array == (JSON_Array *)0x0)) {
        bVar6 = true;
      }
      else {
        index = 0;
        local_b0 = array;
        while( true ) {
          sVar4 = json_array_get_count(array);
          bVar6 = sVar4 <= index;
          if (bVar6) break;
          pJVar3 = json_array_get_object(array,index);
          if (pJVar3 == (JSON_Object *)0x0) {
            if ((int)dataRefs.iLogLevel < 4) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                     ,0x72,"ProcessFetchedData",logERR,"JSON: Could not get %lu. aircraft in \'%s\'"
                     ,index + 1,"ac");
            }
            iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      _vptr_LTChannel[8])(this);
            if ((char)iVar2 == '\0') break;
          }
          else {
            pcVar5 = jog_s(pJVar3,"hex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_150,pcVar5,(allocator<char> *)local_108);
            if (local_148 == (char *)0x0) {
              __s = jog_s(pJVar3,"icao");
              pcVar5 = local_148;
              strlen(__s);
              std::__cxx11::string::_M_replace((ulong)&local_150,0,pcVar5,(ulong)__s);
              if (local_148 == (char *)0x0) {
                bVar7 = false;
              }
              else {
                if ((int)dataRefs.iLogLevel < 3) {
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                         ,0x81,"ProcessFetchedData",logWARN,
                         "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                         (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                         pszChName);
                }
                bVar7 = true;
                (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                  _vptr_LTChannel[8])(this);
              }
            }
            else {
              _eType = KEY_ICAO;
              if ((char)*local_150 == '~') {
                std::__cxx11::string::erase((ulong)&local_150,0);
                _eType = KEY_ADSBEX;
              }
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,local_150,local_148 + (long)local_150);
              LTFlightData::FDKeyTy::FDKeyTy((FDKeyTy *)local_108,_eType,&local_d8,0x10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_a8._M_string_length == 0) {
LAB_0014721c:
                ProcessV2(this,pJVar3,(FDKeyTy *)local_108,local_b8,local_88,(positionTy *)local_78)
                ;
              }
              else {
                local_128 = local_118;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_128,local_a8._M_dataplus._M_p,
                           local_a8._M_dataplus._M_p + local_a8._M_string_length);
                plVar1 = local_128;
                if (local_108._16_8_ == local_120) {
                  if (local_108._16_8_ == 0) {
                    if (local_128 != local_118) {
                      operator_delete(local_128,local_118[0] + 1);
                    }
                    goto LAB_0014721c;
                  }
                  iVar2 = bcmp((void *)local_108._8_8_,local_128,local_108._16_8_);
                  bVar7 = iVar2 != 0;
                }
                else {
                  bVar7 = true;
                }
                if (plVar1 != local_118) {
                  operator_delete(plVar1,local_118[0] + 1);
                }
                if (!bVar7) goto LAB_0014721c;
              }
              bVar7 = false;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._8_8_ != &local_f0) {
                operator_delete((void *)local_108._8_8_,local_f0._M_allocated_capacity + 1);
              }
            }
            if (local_150 != local_140) {
              operator_delete(local_150,local_140[0] + 1);
            }
            array = local_b0;
            if (bVar7) break;
          }
          index = index + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001474b6;
    }
  }
  bVar6 = false;
LAB_001474b6:
  json_value_free(local_130);
  return bVar6;
}

Assistant:

bool ADSBBase::ProcessFetchedData ()
{
    // received an UNAUTHOIZRED response? Then the key is invalid!
    if (httpResponse == HTTP_UNAUTHORIZED || httpResponse == HTTP_FORBIDDEN) {
        SHOW_MSG(logERR, ERR_ADSBEX_KEY_FAILED,
                 netDataPos ? FetchMsg(netData).c_str() : "");
        SetValid(false);
        return false;
    }

    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // first get the structre's main object
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Test for any channel-specific errors
    if (!ProcessErrors(pObj)) return false;
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    
    // for determining an offset as compared to network time we need to know network time
    // Also used later to calcualte the position's timestamp
    double adsbxTime = jog_n_nan(pObj, ADSBEX_NOW);
    if (std::isnan(adsbxTime))
        adsbxTime = jog_n(pObj, ADSBEX_TIME);
    // Convert a timestamp in milliseconds to a timestamp in seconds
    if (adsbxTime > 70000000000.0)
        adsbxTime /= 1000.0;
    
    // if reasonable add this to our time offset calculation
    if (adsbxTime > JAN_FIRST_2019)
        dataRefs.ChTsOffsetAdd(adsbxTime);
    
    // Cut-off time: We ignore tracking data, which is older than our buffering time
    const double tBufPeriod = (double) dataRefs.GetFdBufPeriod();
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // let's cycle the aircraft
    // fetch the aircraft array, adsb.fi defines a different aircraft key unfortunately
    JSON_Array* pJAcList = json_object_get_array(pObj, ADSBEX_AIRCRAFT_ARR);
    if (!pJAcList)
        pJAcList = json_object_get_array(pObj, ADSBFI_AIRCRAFT_ARR);
    // iterate all aircraft in the received flight data (can be 0 or even pJAcList == NULL!)
    for ( size_t i=0; pJAcList && (i < json_array_get_count(pJAcList)); i++ )
    {
        // get the aircraft
        JSON_Object* pJAc = json_array_get_object(pJAcList,i);
        if (!pJAc) {
            LOG_MSG(logERR,ERR_JSON_AC,i+1,ADSBEX_AIRCRAFT_ARR);
            if (IncErrCnt())
                continue;
            else
                return false;
        }
        
        // try version 2 first
        std::string hexKey = jog_s(pJAc, ADSBEX_V2_TRANSP_ICAO);
        if (hexKey.empty()) {
            // not found, try version 1
            hexKey = jog_s(pJAc, ADSBEX_V1_TRANSP_ICAO);
            if (!hexKey.empty()) {
                // Hm...this could be v1 data...since v4.2 we don't process that any longer
                LOG_MSG(logWARN, "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                        ChName());
                IncErrCnt();
                return false;
            }
            // Either way, this can't be processed
            continue;
        }
        
        // the key: transponder Icao code or some other code
        LTFlightData::FDKeyType keyType = LTFlightData::KEY_ICAO;
        if (hexKey.front() == '~') {        // key is a non-icao code?
            hexKey.erase(0, 1);             // remove the ~
            keyType = LTFlightData::KEY_ADSBEX;
        }
        LTFlightData::FDKeyTy fdKey (keyType, hexKey);
        
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;

        // Process the details
        try {
            ProcessV2(pJAc, fdKey, tBufPeriod, adsbxTime, viewPos);
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        } catch(...) {
            LOG_MSG(logERR, "Exception while processing data for '%s'", hexKey.c_str());
        }
    }
    
    // success
    return true;
}